

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall crnlib::mipmapped_texture::flip_y_helper(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = (this->m_faces).m_size == 0;
  if (!bVar5) {
    uVar4 = 0;
    do {
      pvVar1 = (this->m_faces).m_p;
      bVar6 = pvVar1[uVar4].m_size != 0;
      if (bVar6) {
        bVar2 = mip_level::flip_y(*pvVar1[uVar4].m_p);
        if (bVar2) {
          uVar3 = 1;
          do {
            pvVar1 = (this->m_faces).m_p;
            bVar6 = uVar3 < pvVar1[uVar4].m_size;
            if (!bVar6) goto LAB_00135721;
            bVar2 = mip_level::flip_y(pvVar1[uVar4].m_p[uVar3]);
            uVar3 = uVar3 + 1;
          } while (bVar2);
        }
        if (bVar6) {
          return bVar5;
        }
      }
LAB_00135721:
      uVar4 = uVar4 + 1;
      bVar6 = uVar4 < (this->m_faces).m_size;
      bVar5 = !bVar6;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool mipmapped_texture::flip_y_helper() {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (!m_faces[l][m]->flip_y())
        return false;

  return true;
}